

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoCube>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoCube> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh,int64_t *index)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018ac8c0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018ac518,matind,mesh,index);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018ac218;
  pzgeom::TPZNodeRep<8,_pztopology::TPZCube>::TPZNodeRep
            (&(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>,&PTR_PTR_018a5348,nodeindices);
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoCube_018a52f0;
  lVar1 = 0x98;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x58) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
    *(undefined8 *)((long)(&this->fGeo + -1) + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 800);
  lVar1 = 0x98;
  do {
    *(undefined8 *)((long)(&this->fGeo + -1) + lVar1) = 0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 800);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) 
: TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh,index) , fGeo(nodeindices) 
{
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}